

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderCreateInfoWrapper::ShaderCreateInfoWrapper
          (ShaderCreateInfoWrapper *this,ShaderCreateInfo *ShaderCI,IMemoryAllocator *RawAllocator)

{
  STDDeleter<void,_Diligent::IMemoryAllocator> *this_00;
  bool bVar1;
  void *pvVar2;
  Char *pCVar3;
  char (*Args_1) [79];
  ShaderMacro *pSVar4;
  ShaderMacro *pSVar5;
  ulong local_d0;
  size_t i_1;
  ShaderMacro *pMacros;
  string msg;
  unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> local_98 [16];
  ulong local_88;
  size_t i;
  undefined1 local_70 [8];
  FixedLinearAllocator Allocator;
  IMemoryAllocator *RawAllocator_local;
  ShaderCreateInfo *ShaderCI_local;
  ShaderCreateInfoWrapper *this_local;
  
  Allocator._72_8_ = RawAllocator;
  memcpy(this,ShaderCI,0x98);
  RefCntAutoPtr<Diligent::IShaderSourceInputStreamFactory>::RefCntAutoPtr
            (&this->m_SourceFactory,ShaderCI->pShaderSourceStreamFactory);
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
            ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)
             &this->m_pRawMemory);
  FixedLinearAllocator::FixedLinearAllocator
            ((FixedLinearAllocator *)local_70,(IMemoryAllocator *)Allocator._72_8_);
  FixedLinearAllocator::AddSpaceForString((FixedLinearAllocator *)local_70,ShaderCI->EntryPoint,0);
  FixedLinearAllocator::AddSpaceForString
            ((FixedLinearAllocator *)local_70,(ShaderCI->Desc).super_DeviceObjectAttribs.Name,0);
  FixedLinearAllocator::AddSpaceForString
            ((FixedLinearAllocator *)local_70,(ShaderCI->Desc).CombinedSamplerSuffix,0);
  FixedLinearAllocator::AddSpaceForString
            ((FixedLinearAllocator *)local_70,ShaderCI->GLSLExtensions,0);
  FixedLinearAllocator::AddSpaceForString
            ((FixedLinearAllocator *)local_70,ShaderCI->WebGPUEmulatedArrayIndexSuffix,0);
  if ((ShaderCI->ByteCode == (void *)0x0) || ((ShaderCI->field_4).SourceLength == 0)) {
    if (ShaderCI->Source == (Char *)0x0) {
      if ((ShaderCI->FilePath == (Char *)0x0) ||
         (ShaderCI->pShaderSourceStreamFactory == (IShaderSourceInputStreamFactory *)0x0)) {
        LogError<true,char[93]>
                  (false,"ShaderCreateInfoWrapper",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ShaderBase.cpp"
                   ,0x3c,(char (*) [93])
                         "Shader create info must contain Source, Bytecode or FilePath with pShaderSourceStreamFactory"
                  );
      }
      else {
        FixedLinearAllocator::AddSpaceForString
                  ((FixedLinearAllocator *)local_70,ShaderCI->FilePath,0);
      }
    }
    else {
      FixedLinearAllocator::AddSpaceForString
                ((FixedLinearAllocator *)local_70,ShaderCI->Source,(ShaderCI->field_4).SourceLength)
      ;
    }
  }
  else {
    FixedLinearAllocator::AddSpace
              ((FixedLinearAllocator *)local_70,(ShaderCI->field_4).SourceLength,4);
  }
  bVar1 = ShaderMacroArray::operator_cast_to_bool(&ShaderCI->Macros);
  if (bVar1) {
    FixedLinearAllocator::AddSpace<Diligent::ShaderMacro>
              ((FixedLinearAllocator *)local_70,(ulong)(ShaderCI->Macros).Count);
    for (local_88 = 0; local_88 < (ShaderCI->Macros).Count; local_88 = local_88 + 1) {
      pSVar4 = ShaderMacroArray::operator[](&ShaderCI->Macros,local_88);
      FixedLinearAllocator::AddSpaceForString((FixedLinearAllocator *)local_70,pSVar4->Name,0);
      pSVar4 = ShaderMacroArray::operator[](&ShaderCI->Macros,local_88);
      FixedLinearAllocator::AddSpaceForString((FixedLinearAllocator *)local_70,pSVar4->Definition,0)
      ;
    }
  }
  FixedLinearAllocator::Reserve((FixedLinearAllocator *)local_70);
  pvVar2 = FixedLinearAllocator::ReleaseOwnership((FixedLinearAllocator *)local_70);
  this_00 = (STDDeleter<void,_Diligent::IMemoryAllocator> *)((long)&msg.field_2 + 8);
  STDDeleter<void,_Diligent::IMemoryAllocator>::STDDeleter
            (this_00,(IMemoryAllocator *)Allocator._72_8_);
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>(local_98,pvVar2,this_00);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
            (&this->m_pRawMemory,
             (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)local_98);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)local_98);
  pCVar3 = FixedLinearAllocator::CopyString((FixedLinearAllocator *)local_70,ShaderCI->EntryPoint,0)
  ;
  (this->m_CreateInfo).EntryPoint = pCVar3;
  pCVar3 = FixedLinearAllocator::CopyString
                     ((FixedLinearAllocator *)local_70,
                      (ShaderCI->Desc).super_DeviceObjectAttribs.Name,0);
  (this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = pCVar3;
  pCVar3 = FixedLinearAllocator::CopyString
                     ((FixedLinearAllocator *)local_70,(ShaderCI->Desc).CombinedSamplerSuffix,0);
  (this->m_CreateInfo).Desc.CombinedSamplerSuffix = pCVar3;
  pCVar3 = FixedLinearAllocator::CopyString
                     ((FixedLinearAllocator *)local_70,ShaderCI->GLSLExtensions,0);
  (this->m_CreateInfo).GLSLExtensions = pCVar3;
  Args_1 = (char (*) [79])
           FixedLinearAllocator::CopyString
                     ((FixedLinearAllocator *)local_70,ShaderCI->WebGPUEmulatedArrayIndexSuffix,0);
  (this->m_CreateInfo).WebGPUEmulatedArrayIndexSuffix = (char *)Args_1;
  if ((this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name == (Char *)0x0) {
    Args_1 = (char (*) [79])0xe30c4c;
    (this->m_CreateInfo).Desc.super_DeviceObjectAttribs.Name = "";
  }
  if ((ShaderCI->ByteCode == (void *)0x0) || ((ShaderCI->field_4).SourceLength == 0)) {
    if (ShaderCI->Source == (Char *)0x0) {
      if ((ShaderCI->FilePath == (Char *)0x0) ||
         (ShaderCI->pShaderSourceStreamFactory == (IShaderSourceInputStreamFactory *)0x0)) {
        FormatString<char[26],char[79]>
                  ((string *)&pMacros,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr",
                   Args_1);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"ShaderCreateInfoWrapper",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/ShaderBase.cpp"
                   ,0x62);
        std::__cxx11::string::~string((string *)&pMacros);
      }
      pCVar3 = FixedLinearAllocator::CopyString
                         ((FixedLinearAllocator *)local_70,ShaderCI->FilePath,0);
      (this->m_CreateInfo).FilePath = pCVar3;
    }
    else {
      pCVar3 = FixedLinearAllocator::CopyString
                         ((FixedLinearAllocator *)local_70,ShaderCI->Source,
                          (ShaderCI->field_4).SourceLength);
      (this->m_CreateInfo).Source = pCVar3;
      (this->m_CreateInfo).field_4 = ShaderCI->field_4;
    }
  }
  else {
    pvVar2 = FixedLinearAllocator::Copy
                       ((FixedLinearAllocator *)local_70,ShaderCI->ByteCode,
                        (ShaderCI->field_4).SourceLength,4);
    (this->m_CreateInfo).ByteCode = pvVar2;
  }
  bVar1 = ShaderMacroArray::operator_cast_to_bool(&ShaderCI->Macros);
  if (bVar1) {
    pSVar4 = FixedLinearAllocator::ConstructArray<Diligent::ShaderMacro>
                       ((FixedLinearAllocator *)local_70,(ulong)(ShaderCI->Macros).Count);
    (this->m_CreateInfo).Macros.Elements = pSVar4;
    for (local_d0 = 0; local_d0 < (ShaderCI->Macros).Count; local_d0 = local_d0 + 1) {
      pSVar5 = ShaderMacroArray::operator[](&ShaderCI->Macros,local_d0);
      pCVar3 = FixedLinearAllocator::CopyString((FixedLinearAllocator *)local_70,pSVar5->Name,0);
      pSVar4[local_d0].Name = pCVar3;
      pSVar5 = ShaderMacroArray::operator[](&ShaderCI->Macros,local_d0);
      pCVar3 = FixedLinearAllocator::CopyString
                         ((FixedLinearAllocator *)local_70,pSVar5->Definition,0);
      pSVar4[local_d0].Definition = pCVar3;
    }
  }
  FixedLinearAllocator::~FixedLinearAllocator((FixedLinearAllocator *)local_70);
  return;
}

Assistant:

ShaderCreateInfoWrapper::ShaderCreateInfoWrapper(const ShaderCreateInfo& ShaderCI,
                                                 IMemoryAllocator&       RawAllocator) noexcept(false) :
    m_CreateInfo{ShaderCI},
    m_SourceFactory{ShaderCI.pShaderSourceStreamFactory}
{
    FixedLinearAllocator Allocator{RawAllocator};

    Allocator.AddSpaceForString(ShaderCI.EntryPoint);
    Allocator.AddSpaceForString(ShaderCI.Desc.Name);
    Allocator.AddSpaceForString(ShaderCI.Desc.CombinedSamplerSuffix);
    Allocator.AddSpaceForString(ShaderCI.GLSLExtensions);
    Allocator.AddSpaceForString(ShaderCI.WebGPUEmulatedArrayIndexSuffix);

    if (ShaderCI.ByteCode && ShaderCI.ByteCodeSize > 0)
    {
        Allocator.AddSpace(ShaderCI.ByteCodeSize, alignof(Uint32));
    }
    else if (ShaderCI.Source != nullptr)
    {
        Allocator.AddSpaceForString(ShaderCI.Source, ShaderCI.SourceLength);
    }
    else if (ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr)
    {
        Allocator.AddSpaceForString(ShaderCI.FilePath);
    }
    else
    {
        LOG_ERROR_AND_THROW("Shader create info must contain Source, Bytecode or FilePath with pShaderSourceStreamFactory");
    }

    if (ShaderCI.Macros)
    {
        Allocator.AddSpace<ShaderMacro>(ShaderCI.Macros.Count);

        for (size_t i = 0; i < ShaderCI.Macros.Count; ++i)
        {
            Allocator.AddSpaceForString(ShaderCI.Macros[i].Name);
            Allocator.AddSpaceForString(ShaderCI.Macros[i].Definition);
        }
    }

    Allocator.Reserve();

    m_pRawMemory = decltype(m_pRawMemory){Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

    m_CreateInfo.EntryPoint                     = Allocator.CopyString(ShaderCI.EntryPoint);
    m_CreateInfo.Desc.Name                      = Allocator.CopyString(ShaderCI.Desc.Name);
    m_CreateInfo.Desc.CombinedSamplerSuffix     = Allocator.CopyString(ShaderCI.Desc.CombinedSamplerSuffix);
    m_CreateInfo.GLSLExtensions                 = Allocator.CopyString(ShaderCI.GLSLExtensions);
    m_CreateInfo.WebGPUEmulatedArrayIndexSuffix = Allocator.CopyString(ShaderCI.WebGPUEmulatedArrayIndexSuffix);

    if (m_CreateInfo.Desc.Name == nullptr)
        m_CreateInfo.Desc.Name = "";

    if (ShaderCI.ByteCode && ShaderCI.ByteCodeSize > 0)
    {
        m_CreateInfo.ByteCode = Allocator.Copy(ShaderCI.ByteCode, ShaderCI.ByteCodeSize, alignof(Uint32));
    }
    else if (ShaderCI.Source != nullptr)
    {
        m_CreateInfo.Source       = Allocator.CopyString(ShaderCI.Source, ShaderCI.SourceLength);
        m_CreateInfo.SourceLength = ShaderCI.SourceLength;
    }
    else
    {
        VERIFY_EXPR(ShaderCI.FilePath != nullptr && ShaderCI.pShaderSourceStreamFactory != nullptr);
        m_CreateInfo.FilePath = Allocator.CopyString(ShaderCI.FilePath);
    }

    if (ShaderCI.Macros)
    {
        ShaderMacro* pMacros         = Allocator.ConstructArray<ShaderMacro>(ShaderCI.Macros.Count);
        m_CreateInfo.Macros.Elements = pMacros;
        for (size_t i = 0; i < ShaderCI.Macros.Count; ++i)
        {
            pMacros[i].Name       = Allocator.CopyString(ShaderCI.Macros[i].Name);
            pMacros[i].Definition = Allocator.CopyString(ShaderCI.Macros[i].Definition);
        }
    }
}